

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_query.cpp
# Opt level: O0

void __thiscall
create::SerialQuery::SerialQuery
          (SerialQuery *this,shared_ptr<create::Data> *d,bool install_signal_handler)

{
  shared_ptr<create::Data> local_30;
  byte local_19;
  shared_ptr<create::Data> *psStack_18;
  bool install_signal_handler_local;
  shared_ptr<create::Data> *d_local;
  SerialQuery *this_local;
  
  local_19 = install_signal_handler;
  psStack_18 = d;
  d_local = (shared_ptr<create::Data> *)this;
  std::shared_ptr<create::Data>::shared_ptr(&local_30,d);
  Serial::Serial(&this->super_Serial,&local_30,(bool)(local_19 & 1));
  std::shared_ptr<create::Data>::~shared_ptr(&local_30);
  (this->super_Serial)._vptr_Serial = (_func_int **)&PTR_startSensorStream_00201090;
  boost::asio::
  basic_deadline_timer<boost::posix_time::ptime,_boost::asio::time_traits<boost::posix_time::ptime>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_deadline_timer<boost::asio::io_context>
            (&this->streamRecoveryTimer,&(this->super_Serial).io,(type *)0x0);
  this->packetID = '\a';
  this->packetByte = '\0';
  this->packetData = 0;
  this->maxPacketID = '\x1a';
  return;
}

Assistant:

SerialQuery::SerialQuery(std::shared_ptr<Data> d, bool install_signal_handler)
  : Serial(d, install_signal_handler),
    streamRecoveryTimer(io),
    packetID(ID_BUMP_WHEELDROP),
    packetByte(0),
    packetData(0),
    maxPacketID(ID_CAPACITY) {
  }